

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2sc_stdlib.c
# Opt level: O2

char * p2sc_bin2hex(guint8 *bin,size_t len)

{
  byte bVar1;
  char *pcVar2;
  size_t i;
  size_t sVar3;
  
  pcVar2 = (char *)g_malloc(len * 2 + 1);
  for (sVar3 = 0; len != sVar3; sVar3 = sVar3 + 1) {
    bVar1 = bin[sVar3];
    pcVar2[sVar3 * 2] = "0123456789ABCDEF"[bVar1 >> 4];
    pcVar2[sVar3 * 2 + 1] = "0123456789ABCDEF"[bVar1 & 0xf];
  }
  pcVar2[len * 2] = '\0';
  return pcVar2;
}

Assistant:

char *p2sc_bin2hex(const guint8 *bin, size_t len) {
    static const char hexdig[] = "0123456789ABCDEF";

    size_t alen = len * 2;
    char *hex = (char *) g_malloc(alen + 1);

    for (size_t i = 0; i < len; ++i) {
        guint8 b = bin[i];

        hex[2 * i] = hexdig[b >> 4];
        hex[2 * i + 1] = hexdig[b & 0xf];
    }
    hex[alen] = 0;

    return hex;
}